

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Enum.hpp
# Opt level: O3

void Reflection::Enum::declare<Analyser::Static::Amiga::Target::FastRAM>
               (char *name,char *declaration)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  allocator<char> local_a1;
  undefined1 local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  uint local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  char *local_38;
  
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar1 = *declaration;
  local_38 = name;
  if (cVar1 != '\0') {
    do {
      iVar2 = isalpha((int)cVar1);
      if (iVar2 == 0) {
        cVar1 = declaration[1];
        pcVar3 = declaration + 1;
      }
      else {
        pcVar3 = declaration + -1;
        do {
          cVar1 = pcVar3[1];
          pcVar3 = pcVar3 + 1;
          iVar2 = isalpha((int)cVar1);
        } while ((int)cVar1 - 0x30U < 10 || iVar2 != 0);
        local_a0._0_8_ = &local_90;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,declaration,pcVar3);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._0_8_ != &local_90) {
          operator_delete((void *)local_a0._0_8_,local_90._M_allocated_capacity + 1);
        }
        cVar1 = *pcVar3;
      }
      declaration = pcVar3;
    } while (cVar1 != '\0');
  }
  local_a0._0_8_ = &Analyser::Static::Amiga::Target::FastRAM::typeinfo;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_a0 + 8),&local_58);
  std::
  _Hashtable<std::type_index,std::pair<std::type_index_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::type_index_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::__detail::_Select1st,std::equal_to<std::type_index>,std::hash<std::type_index>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<std::type_index,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&members_by_type__abi_cxx11_,local_a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_a0 + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78._M_local_buf,local_38,&local_a1);
  local_a0._0_8_ = &Analyser::Static::Amiga::Target::FastRAM::typeinfo;
  if ((uint *)local_78._M_allocated_capacity == &local_68) {
    uStack_80 = uStack_60;
    uStack_7c = uStack_5c;
    local_a0._8_8_ = local_90._M_local_buf + 8;
  }
  else {
    local_a0._8_8_ = local_78._M_allocated_capacity;
  }
  local_90._12_4_ = uStack_64;
  local_90._8_4_ = local_68;
  local_90._M_allocated_capacity = local_78._8_8_;
  local_78._8_8_ = 0;
  local_68 = local_68 & 0xffffff00;
  local_78._M_allocated_capacity = (size_type)&local_68;
  std::
  _Hashtable<std::type_index,std::pair<std::type_index_const,std::__cxx11::string>,std::allocator<std::pair<std::type_index_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::type_index>,std::hash<std::type_index>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<std::type_index,std::__cxx11::string>>(&names_by_type__abi_cxx11_);
  if ((char *)local_a0._8_8_ != local_90._M_local_buf + 8) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ + 1);
  }
  if ((uint *)local_78._M_allocated_capacity != &local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,CONCAT44(uStack_64,local_68) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

static void declare(const char *name, const char *declaration) {
			const char *d_ptr = declaration;

			std::vector<std::string> result;
			while(true) {
				// Skip non-alphas, and exit if the terminator is found.
				while(*d_ptr && !isalpha(*d_ptr)) ++d_ptr;
				if(!*d_ptr) break;

				// Note the current location and proceed for all alphas and digits.
				const auto start = d_ptr;
				while(isalpha(*d_ptr) || isdigit(*d_ptr)) ++d_ptr;

				// Add a string view.
				result.emplace_back(std::string(start, size_t(d_ptr - start)));
			}

			members_by_type_.emplace(std::make_pair(std::type_index(typeid(Type)), result));
			names_by_type_.emplace(std::make_pair(std::type_index(typeid(Type)), std::string(name)));
		}